

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O3

ini_t * ini_load(char *data,void *memctx)

{
  long lVar1;
  char cVar2;
  int section;
  ini_t *ini;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  char *value;
  int iVar6;
  char *pcVar7;
  
  ini = ini_create(memctx);
  if ((data == (char *)0x0) || (cVar2 = *data, cVar2 == '\0')) {
    return ini;
  }
  section = 0;
joined_r0x0010898e:
  if (cVar2 < '!') {
    cVar2 = data[1];
    data = data + 1;
    if (cVar2 != '\0') goto joined_r0x0010898e;
  }
  if (cVar2 == ';') {
    cVar2 = ';';
    pcVar7 = data;
    while ((cVar2 != '\0' && (cVar2 != '\n'))) {
      pcVar4 = pcVar7 + 1;
      pcVar7 = pcVar7 + 1;
      cVar2 = *pcVar4;
    }
    goto LAB_00108aaa;
  }
  if (cVar2 != '[') {
    if (cVar2 == '\0') {
      return ini;
    }
    pcVar4 = data + 2;
    lVar3 = 0;
    pcVar5 = data;
    while ((pcVar5 = pcVar5 + 1, cVar2 != '\0' && (cVar2 != '\n'))) {
      if (cVar2 == '=') goto LAB_001089f4;
      lVar1 = lVar3 + 1;
      lVar3 = lVar3 + 1;
      pcVar4 = pcVar4 + 1;
      cVar2 = data[lVar1];
    }
    pcVar7 = data + lVar3;
    goto LAB_00108aaa;
  }
  iVar6 = 0;
  for (pcVar7 = data + 1; (cVar2 = *pcVar7, cVar2 != '\0' && (cVar2 != '\n')); pcVar7 = pcVar7 + 1)
  {
    if (cVar2 == ']') {
      section = ini_section_add(ini,data + 1,iVar6);
      pcVar7 = pcVar7 + 1;
      goto LAB_00108aaa;
    }
    iVar6 = iVar6 + 1;
  }
  goto LAB_00108aae;
  while( true ) {
    pcVar4 = pcVar7 + 1;
    pcVar5 = value + 1;
    if (cVar2 == '\0') break;
LAB_001089f4:
    value = pcVar5;
    pcVar7 = pcVar4;
    cVar2 = *value;
    if ((' ' < cVar2) || (cVar2 == '\n')) break;
  }
  iVar6 = 1;
  pcVar4 = value;
  while ((cVar2 != '\n' && (cVar2 != '\0'))) {
    pcVar5 = pcVar4 + 1;
    pcVar4 = pcVar4 + 1;
    pcVar7 = pcVar7 + 1;
    iVar6 = iVar6 + 1;
    cVar2 = *pcVar5;
  }
  do {
    iVar6 = iVar6 + -1;
    pcVar4 = pcVar7 + -2;
    pcVar7 = pcVar7 + -1;
  } while (*pcVar4 < '!');
  ini_property_add(ini,section,data,(int)lVar3,value,iVar6);
LAB_00108aaa:
  cVar2 = *pcVar7;
LAB_00108aae:
  data = pcVar7;
  if (cVar2 == '\0') {
    return ini;
  }
  goto joined_r0x0010898e;
}

Assistant:

ini_t* ini_load( char const* data, void* memctx )
    {
    ini_t* ini;
    char const* ptr;
    int s;
    char const* start;
    char const* start2;
    int l;

    ini = ini_create( memctx );

    ptr = data;
    if( ptr )
        {
        s = 0;
        while( *ptr )
            {
            /* trim leading whitespace */
            while( *ptr && *ptr <=' ' )
                ++ptr;
            
            /* done? */
            if( !*ptr ) break;

            /* comment */
            else if( *ptr == ';' )
                {
                while( *ptr && *ptr !='\n' )
                    ++ptr;
                }
            /* section */
            else if( *ptr == '[' )
                {
                ++ptr;
                start = ptr;
                while( *ptr && *ptr !=']' && *ptr != '\n' )
                    ++ptr;

                if( *ptr == ']' )
                    {
                    s = ini_section_add( ini, start, (int)( ptr - start) );
                    ++ptr;
                    }
                }
            /* property */
            else
                {
                start = ptr;
                while( *ptr && *ptr !='=' && *ptr != '\n' )
                    ++ptr;

                if( *ptr == '=' )
                    {
                    l = (int)( ptr - start);
                    ++ptr;
                    while( *ptr && *ptr <= ' ' && *ptr != '\n' ) 
                        ptr++;
                    start2 = ptr;
                    while( *ptr && *ptr != '\n' )
                        ++ptr;
                    while( *(--ptr) <= ' ' ) 
                        (void)ptr;
                    ptr++;
                    ini_property_add( ini, s, start, l, start2, (int)( ptr - start2) );
                    }
                }
            }
        }   

    return ini;
    }